

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  size_t sVar1;
  Exception *this_00;
  ulong uVar2;
  uint in_ECX;
  int in_EDX;
  Type type;
  DescriptionStyle in_R8D;
  char *in_R9;
  char *pcVar3;
  char *in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffa8;
  String local_48;
  
  pcVar3 = in_R9;
  this_00 = (Exception *)operator_new(0x158);
  type = OVERLOADED;
  uVar2 = (ulong)(in_ECX - 0x57);
  if (in_ECX - 0x57 < 0x24) {
    if ((0x713e000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x800840001U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_002a7a9c;
      if ((0x122UL >> (uVar2 & 0x3f) & 1) == 0) goto LAB_002a7a65;
LAB_002a7a97:
      type = UNIMPLEMENTED;
      goto LAB_002a7a9c;
    }
LAB_002a7a43:
    type = DISCONNECTED;
  }
  else {
LAB_002a7a65:
    uVar2 = (ulong)(in_ECX - 0xc);
    if (in_ECX - 0xc < 0x35) {
      if ((0x2011801UL >> (uVar2 & 0x3f) & 1) != 0) goto LAB_002a7a9c;
      if ((0x10000000100000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_002a7a43;
      if (uVar2 == 0x1a) goto LAB_002a7a97;
    }
    type = FAILED;
  }
LAB_002a7a9c:
  argValues.size_._0_4_ = in_stack_ffffffffffffffa8;
  argValues.ptr = (String *)in_stack_00000010;
  argValues.size_._4_4_ = in_EDX;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,(anon_unknown_2 *)0x2,in_R8D,(char *)(ulong)in_ECX,(int)in_R9,pcVar3,
             in_stack_00000008,argValues);
  Exception::Exception(this_00,type,(char *)ctx,in_EDX,&local_48);
  sVar1 = local_48.content.size_;
  pcVar3 = local_48.content.ptr;
  this->exception = this_00;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    this = (Fault *)(*(code *)**(undefined8 **)local_48.content.disposer)
                              (local_48.content.disposer,pcVar3,1,sVar1,sVar1,0);
  }
  return (int)this;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, int osErrorNumber,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(typeOfErrno(osErrorNumber), file, line,
      makeDescriptionImpl(SYSCALL, condition, osErrorNumber, nullptr, macroArgs, argValues));
}